

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract(defV *data,complex<double> *val)

{
  double __r;
  string_view val_00;
  string_view val_01;
  bool bVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  double *pdVar3;
  long *plVar4;
  complex<double> *pcVar5;
  vector<double,_std::allocator<double>_> *this_00;
  size_type sVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  NamedPoint *pNVar9;
  int in_EDX;
  size_t *in_RSI;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RDI;
  size_t extraout_XMM0_Qa;
  size_t extraout_XMM0_Qa_00;
  size_t in_XMM1_Qa;
  NamedPoint *point;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vec_1;
  vector<double,_std::allocator<double>_> *vec;
  size_t local_b8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffff50;
  complex<double> local_78;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  complex<double> local_30;
  complex<double> local_20;
  size_t *local_10;
  
  local_10 = in_RSI;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ::index(in_RDI,(char *)in_RSI,in_EDX);
  switch(this) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    pdVar3 = std::
             get<double,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x424d28);
    std::complex<double>::complex(&local_20,*pdVar3,0.0);
    *local_10 = local_20._M_value._0_8_;
    local_10[1] = local_20._M_value._8_8_;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    plVar4 = std::
             get<long,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x424d6d);
    std::complex<double>::complex(&local_30,(double)*plVar4,0.0);
    *local_10 = local_30._M_value._0_8_;
    local_10[1] = local_30._M_value._8_8_;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
  default:
    std::
    get<std::__cxx11::string,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x424db5);
    std::__cxx11::string::operator_cast_to_basic_string_view(this);
    val_00._M_str = in_stack_ffffffffffffffa0;
    val_00._M_len = in_stack_ffffffffffffff98;
    getComplexFromString(val_00);
    *local_10 = extraout_XMM0_Qa;
    local_10[1] = in_XMM1_Qa;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    pcVar5 = std::
             get<std::complex<double>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x424e1f);
    *local_10 = *(size_t *)pcVar5->_M_value;
    local_10[1] = *(size_t *)(pcVar5->_M_value + 8);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    this_00 = std::
              get<std::vector<double,std::allocator<double>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                        ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                          *)0x424e4a);
    sVar6 = std::vector<double,_std::allocator<double>_>::size(this_00);
    if (sVar6 == 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
      std::complex<double>::complex((complex<double> *)&stack0xffffffffffffff98,*pvVar7,0.0);
      *local_10 = in_stack_ffffffffffffff98;
      local_10[1] = (size_t)in_stack_ffffffffffffffa0;
    }
    else {
      sVar6 = std::vector<double,_std::allocator<double>_>::size(this_00);
      if (1 < sVar6) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
        __r = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_00,1);
        std::complex<double>::complex(&local_78,__r,*pvVar7);
        *local_10 = local_78._M_value._0_8_;
        local_10[1] = local_78._M_value._8_8_;
      }
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    std::
    get<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x424f0f);
    bVar1 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::empty
                      (in_stack_ffffffffffffff50);
    if (!bVar1) {
      pvVar8 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::front
                         ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          this);
      *local_10 = *(size_t *)pvVar8->_M_value;
      local_10[1] = *(size_t *)(pvVar8->_M_value + 8);
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
    pNVar9 = std::
             get<helics::NamedPoint,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x424f57);
    uVar2 = std::isnan(pNVar9->value);
    if ((uVar2 & 1) == 0) {
      std::complex<double>::complex((complex<double> *)&local_b8,pNVar9->value,0.0);
      *local_10 = local_b8;
      local_10[1] = (size_t)in_stack_ffffffffffffff50;
    }
    else {
      std::__cxx11::string::operator_cast_to_basic_string_view(this);
      val_01._M_str = in_stack_ffffffffffffffa0;
      val_01._M_len = in_stack_ffffffffffffff98;
      getComplexFromString(val_01);
      *local_10 = extraout_XMM0_Qa_00;
      local_10[1] = in_XMM1_Qa;
    }
  }
  return;
}

Assistant:

void valueExtract(const defV& data, std::complex<double>& val)
{
    switch (data.index()) {
        case double_loc:  // double
            val = std::complex<double>(std::get<double>(data), 0.0);
            break;
        case int_loc:  // int64_t
            val = std::complex<double>(static_cast<double>(std::get<int64_t>(data)), 0.0);
            break;
        case string_loc:  // string
        default:
            val = getComplexFromString(std::get<std::string>(data));
            break;
        case complex_loc:  // complex
            val = std::get<std::complex<double>>(data);
            break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            if (vec.size() == 1) {
                val = std::complex<double>(vec[0], 0.0);
            } else if (vec.size() >= 2) {
                val = std::complex<double>(vec[0], vec[1]);
            }
            break;
        }
        case complex_vector_loc: {
            const auto& vec = std::get<std::vector<std::complex<double>>>(data);
            if (!vec.empty()) {
                val = vec.front();
            }
            break;
        }
        case named_point_loc: {
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                val = getComplexFromString(point.name);
            } else {
                val = std::complex<double>(point.value, 0.0);
            }
        } break;
    }
}